

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::GenerateHeader
          (FileGenerator *this,Printer *printer)

{
  pointer *__return_storage_ptr__;
  undefined *puVar1;
  int iVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  FileDescriptor *file;
  reference value;
  reference ppEVar6;
  size_type sVar7;
  reference ppEVar8;
  reference ppMVar9;
  int i_00;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_210;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_208;
  iterator iter_4;
  __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
  local_1f8;
  iterator iter_3;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_1e8;
  iterator iter_2;
  __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
  local_1d8;
  iterator iter_1;
  _Self local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  const_iterator i_1;
  __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
  local_1a8;
  iterator iter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fwd_decls;
  int i;
  string header_extension;
  ImportWriter import_writer;
  allocator local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"GPBProtocolBuffers.h",&local_39);
  PrintFileRuntimePreamble(this,printer,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pPVar3 = local_18;
  __return_storage_ptr__ =
       &import_writer.other_imports_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  SimpleItoa_abi_cxx11_((string *)__return_storage_ptr__,(protobuf *)0x7532,i_00);
  io::Printer::Print(pPVar3,
                     "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n#endif\n\n"
                     ,"google_protobuf_objc_version",(string *)__return_storage_ptr__);
  std::__cxx11::string::~string
            ((string *)
             &import_writer.other_imports_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ImportWriter::ImportWriter
            ((ImportWriter *)((long)&header_extension.field_2 + 8),
             &(this->options_).generate_for_named_framework,
             &(this->options_).named_framework_to_proto_path_mappings_path);
  puVar1 = (anonymous_namespace)::kHeaderExtension;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&i,puVar1,
             (allocator *)((long)&fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  for (fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
      iVar2 = (int)fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count,
      iVar5 = FileDescriptor::public_dependency_count(this->file_), iVar2 < iVar5;
      fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    file = FileDescriptor::public_dependency
                     (this->file_,(int)fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ImportWriter::AddFile((ImportWriter *)((long)&header_extension.field_2 + 8),file,(string *)&i);
  }
  ImportWriter::Print((ImportWriter *)((long)&header_extension.field_2 + 8),local_18);
  std::__cxx11::string::~string((string *)&i);
  ImportWriter::~ImportWriter((ImportWriter *)((long)&header_extension.field_2 + 8));
  io::Printer::Print(local_18,
                     "// @@protoc_insertion_point(imports)\n\n#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n\nCF_EXTERN_C_BEGIN\n\n"
                    );
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&iter);
  local_1a8._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->message_generators_);
  while( true ) {
    i_1._M_node = (_Base_ptr)
                  std::
                  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                  ::end(&this->message_generators_);
    bVar4 = __gnu_cxx::operator!=
                      (&local_1a8,
                       (__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                        *)&i_1);
    if (!bVar4) break;
    ppMVar9 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              ::operator*(&local_1a8);
    MessageGenerator::DetermineForwardDeclarations
              (*ppMVar9,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&iter);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_1a8);
  }
  local_1b8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter);
  while( true ) {
    local_1c0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter);
    bVar4 = std::operator!=(&local_1b8,&local_1c0);
    pPVar3 = local_18;
    if (!bVar4) break;
    value = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_1b8);
    io::Printer::Print(pPVar3,"$value$;\n","value",value);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_1b8);
  }
  local_1c8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&iter);
  iter_1._M_current =
       (EnumGenerator **)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&iter);
  bVar4 = std::operator!=(&local_1c8,(_Self *)&iter_1);
  if (bVar4) {
    io::Printer::Print(local_18,"\n");
  }
  io::Printer::Print(local_18,"NS_ASSUME_NONNULL_BEGIN\n\n");
  local_1d8._M_current =
       (EnumGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
       ::begin(&this->enum_generators_);
  while( true ) {
    iter_2._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
         ::end(&this->enum_generators_);
    bVar4 = __gnu_cxx::operator!=
                      (&local_1d8,
                       (__normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
                        *)&iter_2);
    if (!bVar4) break;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
              ::operator*(&local_1d8);
    EnumGenerator::GenerateHeader(*ppEVar6,local_18);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::EnumGenerator_**,_std::vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>_>
    ::operator++(&local_1d8);
  }
  local_1e8._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->message_generators_);
  while( true ) {
    iter_3._M_current =
         (ExtensionGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::end(&this->message_generators_);
    bVar4 = __gnu_cxx::operator!=
                      (&local_1e8,
                       (__normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
                        *)&iter_3);
    if (!bVar4) break;
    ppMVar9 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              ::operator*(&local_1e8);
    MessageGenerator::GenerateEnumHeader(*ppMVar9,local_18);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_1e8);
  }
  io::Printer::Print(local_18,
                     "#pragma mark - $root_class_name$\n\n/**\n * Exposes the extension registry for this file.\n *\n * The base class provides:\n * @code\n *   + (GPBExtensionRegistry *)extensionRegistry;\n * @endcode\n * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n * this file and all files that it depends on.\n **/\n@interface $root_class_name$ : GPBRootObject\n@end\n\n"
                     ,"root_class_name",&this->root_class_name_);
  sVar7 = std::
          vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
          ::size(&this->extension_generators_);
  if (sVar7 != 0) {
    io::Printer::Print(local_18,"@interface $root_class_name$ (DynamicMethods)\n","root_class_name",
                       &this->root_class_name_);
    local_1f8._M_current =
         (ExtensionGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
         ::begin(&this->extension_generators_);
    while( true ) {
      iter_4._M_current =
           (MessageGenerator **)
           std::
           vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
           ::end(&this->extension_generators_);
      bVar4 = __gnu_cxx::operator!=
                        (&local_1f8,
                         (__normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
                          *)&iter_4);
      if (!bVar4) break;
      ppEVar8 = __gnu_cxx::
                __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
                ::operator*(&local_1f8);
      ExtensionGenerator::GenerateMembersHeader(*ppEVar8,local_18);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::objectivec::ExtensionGenerator_**,_std::vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>_>
      ::operator++(&local_1f8);
    }
    io::Printer::Print(local_18,"@end\n\n");
  }
  local_208._M_current =
       (MessageGenerator **)
       std::
       vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
       ::begin(&this->message_generators_);
  while( true ) {
    local_210._M_current =
         (MessageGenerator **)
         std::
         vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
         ::end(&this->message_generators_);
    bVar4 = __gnu_cxx::operator!=(&local_208,&local_210);
    if (!bVar4) break;
    ppMVar9 = __gnu_cxx::
              __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
              ::operator*(&local_208);
    MessageGenerator::GenerateMessageHeader(*ppMVar9,local_18);
    __gnu_cxx::
    __normal_iterator<google::protobuf::compiler::objectivec::MessageGenerator_**,_std::vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>_>
    ::operator++(&local_208);
  }
  io::Printer::Print(local_18,
                     "NS_ASSUME_NONNULL_END\n\nCF_EXTERN_C_END\n\n#pragma clang diagnostic pop\n\n// @@protoc_insertion_point(global_scope)\n"
                    );
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&iter);
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer *printer) {
  PrintFileRuntimePreamble(printer, "GPBProtocolBuffers.h");

  // Add some verification that the generated code matches the source the
  // code is being compiled with.
  // NOTE: This captures the raw numeric values at the time the generator was
  // compiled, since that will be the versions for the ObjC runtime at that
  // time.  The constants in the generated code will then get their values at
  // at compile time (so checking against the headers being used to compile).
  printer->Print(
      "#if GOOGLE_PROTOBUF_OBJC_VERSION < $google_protobuf_objc_version$\n"
      "#error This file was generated by a newer version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "#if $google_protobuf_objc_version$ < GOOGLE_PROTOBUF_OBJC_MIN_SUPPORTED_VERSION\n"
      "#error This file was generated by an older version of protoc which is incompatible with your Protocol Buffer library sources.\n"
      "#endif\n"
      "\n",
      "google_protobuf_objc_version", SimpleItoa(GOOGLE_PROTOBUF_OBJC_VERSION));

  // #import any headers for "public imports" in the proto file.
  {
    ImportWriter import_writer(
        options_.generate_for_named_framework,
        options_.named_framework_to_proto_path_mappings_path);
    const string header_extension(kHeaderExtension);
    for (int i = 0; i < file_->public_dependency_count(); i++) {
      import_writer.AddFile(file_->public_dependency(i), header_extension);
    }
    import_writer.Print(printer);
  }

  // Note:
  //  deprecated-declarations suppression is only needed if some place in this
  //    proto file is something deprecated or if it references something from
  //    another file that is deprecated.
  printer->Print(
      "// @@protoc_insertion_point(imports)\n"
      "\n"
      "#pragma clang diagnostic push\n"
      "#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n"
      "\n"
      "CF_EXTERN_C_BEGIN\n"
      "\n");

  set<string> fwd_decls;
  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->DetermineForwardDeclarations(&fwd_decls);
  }
  for (set<string>::const_iterator i(fwd_decls.begin());
       i != fwd_decls.end(); ++i) {
    printer->Print("$value$;\n", "value", *i);
  }
  if (fwd_decls.begin() != fwd_decls.end()) {
    printer->Print("\n");
  }

  printer->Print(
      "NS_ASSUME_NONNULL_BEGIN\n"
      "\n");

  // need to write out all enums first
  for (vector<EnumGenerator *>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateHeader(printer);
  }

  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->GenerateEnumHeader(printer);
  }

  // For extensions to chain together, the Root gets created even if there
  // are no extensions.
  printer->Print(
      "#pragma mark - $root_class_name$\n"
      "\n"
      "/**\n"
      " * Exposes the extension registry for this file.\n"
      " *\n"
      " * The base class provides:\n"
      " * @code\n"
      " *   + (GPBExtensionRegistry *)extensionRegistry;\n"
      " * @endcode\n"
      " * which is a @c GPBExtensionRegistry that includes all the extensions defined by\n"
      " * this file and all files that it depends on.\n"
      " **/\n"
      "@interface $root_class_name$ : GPBRootObject\n"
      "@end\n"
      "\n",
      "root_class_name", root_class_name_);

  if (extension_generators_.size() > 0) {
    // The dynamic methods block is only needed if there are extensions.
    printer->Print(
        "@interface $root_class_name$ (DynamicMethods)\n",
        "root_class_name", root_class_name_);

    for (vector<ExtensionGenerator *>::iterator iter =
             extension_generators_.begin();
         iter != extension_generators_.end(); ++iter) {
      (*iter)->GenerateMembersHeader(printer);
    }

    printer->Print("@end\n\n");
  }  // extension_generators_.size() > 0

  for (vector<MessageGenerator *>::iterator iter = message_generators_.begin();
       iter != message_generators_.end(); ++iter) {
    (*iter)->GenerateMessageHeader(printer);
  }

  printer->Print(
      "NS_ASSUME_NONNULL_END\n"
      "\n"
      "CF_EXTERN_C_END\n"
      "\n"
      "#pragma clang diagnostic pop\n"
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}